

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall AixLog::Log::sync(Log *this)

{
  byte bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  element_type *peVar3;
  Metadata *pMVar4;
  Log *this_01;
  stringstream *psVar5;
  shared_ptr<AixLog::Sink> *sink;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> *__range4;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff08;
  __normal_iterator<std::shared_ptr<AixLog::Sink>_*,_std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>_>
  *in_stack_ffffffffffffff10;
  Log *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [16];
  Metadata *in_stack_ffffffffffffff90;
  Filter *in_stack_ffffffffffffff98;
  __normal_iterator<std::shared_ptr<AixLog::Sink>_*,_std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>_>
  local_50;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> *local_48;
  string local_30 [40];
  Log *local_8;
  
  local_8 = this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
            );
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            get_stream_abi_cxx11_(in_stack_ffffffffffffff20);
  std::__cxx11::stringstream::str();
  bVar1 = std::__cxx11::string::empty();
  bVar1 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_30);
  if ((bVar1 & 1) != 0) {
    bVar2 = Conditional::is_true(&this->conditional_);
    if (bVar2) {
      local_48 = &this->log_sinks_;
      local_50._M_current =
           (shared_ptr<AixLog::Sink> *)
           std::
           vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
           begin((vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>
                  *)in_stack_ffffffffffffff08);
      std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
      end((vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> *)
          in_stack_ffffffffffffff08);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_ffffffffffffff10,
                                (__normal_iterator<std::shared_ptr<AixLog::Sink>_*,_std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>_>
                                 *)in_stack_ffffffffffffff08), bVar2) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<AixLog::Sink>_*,_std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>_>
        ::operator*(&local_50);
        std::__shared_ptr_access<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1c87b9);
        in_stack_ffffffffffffff46 =
             Filter::match(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        if ((bool)in_stack_ffffffffffffff46) {
          peVar3 = std::__shared_ptr_access<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<AixLog::Sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1c87ee);
          pMVar4 = &this->metadata_;
          get_stream_abi_cxx11_(in_stack_ffffffffffffff20);
          std::__cxx11::stringstream::str();
          (*peVar3->_vptr_Sink[2])(peVar3,pMVar4,local_80);
          std::__cxx11::string::~string(local_80);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<AixLog::Sink>_*,_std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>_>
        ::operator++(&local_50);
      }
    }
    this_01 = (Log *)get_stream_abi_cxx11_(in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)this,
               (allocator<char> *)
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    std::__cxx11::stringstream::str((string *)this_01);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    psVar5 = get_stream_abi_cxx11_(this_01);
    std::ios::clear(psVar5 + *(long *)(*(long *)psVar5 + -0x18),0);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c896e);
  return;
}

Assistant:

int sync() override {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if (!get_stream().str().empty()) {
      if (conditional_.is_true()) {
        for (const auto& sink : log_sinks_) {
          if (sink->filter.match(metadata_))
            sink->log(metadata_, get_stream().str());
        }
      }
      get_stream().str("");
      get_stream().clear();
    }

    return 0;
  }